

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O1

uint32_t * unpack8_16(uint32_t base,uint32_t *in,uint32_t *out)

{
  *out = (byte)*in + base;
  out[1] = *(byte *)((long)in + 1) + base;
  out[2] = *(byte *)((long)in + 2) + base;
  out[3] = *(byte *)((long)in + 3) + base;
  out[4] = (byte)in[1] + base;
  out[5] = *(byte *)((long)in + 5) + base;
  out[6] = *(byte *)((long)in + 6) + base;
  out[7] = *(byte *)((long)in + 7) + base;
  out[8] = (byte)in[2] + base;
  out[9] = *(byte *)((long)in + 9) + base;
  out[10] = *(byte *)((long)in + 10) + base;
  out[0xb] = *(byte *)((long)in + 0xb) + base;
  out[0xc] = (byte)in[3] + base;
  out[0xd] = *(byte *)((long)in + 0xd) + base;
  out[0xe] = *(byte *)((long)in + 0xe) + base;
  out[0xf] = *(byte *)((long)in + 0xf) + base;
  return in + 4;
}

Assistant:

uint32_t * unpack8_16( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  )   % (1U << 8 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  8  )   % (1U << 8 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  16  )   % (1U << 8 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  24  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  )   % (1U << 8 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  8  )   % (1U << 8 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  16  )   % (1U << 8 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  24  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  )   % (1U << 8 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  8  )   % (1U << 8 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  16  )   % (1U << 8 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  24  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  )   % (1U << 8 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  8  )   % (1U << 8 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  16  )   % (1U << 8 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  24  ) ;
    ++in;
    *out += base;
    out++;

    return in;
}